

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawRectangleLinesEx(Rectangle rec,int lineThick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Rectangle rec_00;
  Rectangle rec_01;
  Rectangle rec_02;
  Rectangle rec_03;
  
  rec_00.width = rec.width;
  fVar1 = rec.height;
  rec_01.x = rec.x;
  if (((rec_00.width < (float)lineThick) || (fVar1 < (float)lineThick)) &&
     ((fVar2 = fVar1, fVar1 < rec_00.width || (fVar2 = rec_00.width, rec_00.width < fVar1)))) {
    lineThick = (int)fVar2 / 2;
  }
  fVar4 = (float)lineThick;
  fVar2 = rec.y + fVar4;
  fVar3 = fVar1 - (fVar4 + fVar4);
  rec_00.height = fVar4;
  rec_00.x = (float)(int)rec._0_8_;
  rec_00.y = (float)(int)((ulong)rec._0_8_ >> 0x20);
  DrawRectangleRec(rec_00,color);
  rec_01.height = fVar4;
  rec_01.width = rec_00.width;
  rec_01.y = (rec.y - fVar4) + fVar1;
  DrawRectangleRec(rec_01,color);
  rec_02.y = fVar2;
  rec_02.x = rec_01.x;
  rec_02.height = fVar3;
  rec_02.width = fVar4;
  DrawRectangleRec(rec_02,color);
  rec_03.height = fVar3;
  rec_03.width = fVar4;
  rec_03.y = fVar2;
  rec_03.x = (rec_01.x - fVar4) + rec_00.width;
  DrawRectangleRec(rec_03,color);
  return;
}

Assistant:

void DrawRectangleLinesEx(Rectangle rec, int lineThick, Color color)
{
    if ((lineThick > rec.width) || (lineThick > rec.height))
    {
        if (rec.width > rec.height) lineThick = (int)rec.height/2;
        else if (rec.width < rec.height) lineThick = (int)rec.width/2;
    }

    // When rec = { x, y, 8.0f, 6.0f } and lineThick = 2, the following
    // four rectangles are drawn ([T]op, [B]ottom, [L]eft, [R]ight):
    //
    //   TTTTTTTT
    //   TTTTTTTT
    //   LL    RR
    //   LL    RR
    //   BBBBBBBB
    //   BBBBBBBB
    //
    float thick = (float)lineThick;
    Rectangle top = { rec.x, rec.y, rec.width, thick };
    Rectangle bottom = { rec.x, rec.y - thick + rec.height, rec.width, thick };
    Rectangle left = { rec.x, rec.y + thick, thick, rec.height - thick*2.0f };
    Rectangle right = { rec.x - thick + rec.width, rec.y + thick, thick, rec.height - thick*2.0f };

    DrawRectangleRec(top, color);
    DrawRectangleRec(bottom, color);
    DrawRectangleRec(left, color);
    DrawRectangleRec(right, color);
}